

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O3

void mahjong::adjust_by_waiting_form
               (pack_t *concealed_packs,intptr_t pack_cnt,tile_t *standing_tiles,
               intptr_t standing_cnt,tile_t win_tile,fan_table_t *fan_table)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  difference_type __n;
  long lVar7;
  long lVar8;
  bool *pbVar9;
  byte *pbVar10;
  byte bVar11;
  useful_table_t waiting_table;
  useful_table_t temp_table;
  useful_table_t useful_table;
  bool local_118 [80];
  byte local_c8 [80];
  bool local_78 [72];
  
  bVar11 = 0;
  if ((*fan_table)[5] == 0 && (*fan_table)[0x34] == 0) {
    bVar5 = is_basic_form_wait(standing_tiles,standing_cnt,(useful_table_t *)local_118);
    if (bVar5) {
      if ((pack_cnt == 5) &&
         (iVar6 = seven_pairs_shanten(standing_tiles,standing_cnt,&local_78), iVar6 == 0)) {
        pbVar9 = local_78;
        pbVar10 = local_c8;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined8 *)pbVar10 = *(undefined8 *)pbVar9;
          pbVar9 = pbVar9 + ((ulong)bVar11 * -2 + 1) * 8;
          pbVar10 = pbVar10 + ((ulong)bVar11 * -2 + 1) * 8;
        }
        lVar7 = 0;
        do {
          local_118[lVar7] = (bool)(local_118[lVar7] | local_c8[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x48);
      }
      lVar7 = 0;
      lVar8 = 0;
      do {
        lVar7 = lVar7 + (ulong)local_118[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x48);
      if (0 < pack_cnt && lVar7 == 1) {
        bVar2 = false;
        bVar5 = false;
        lVar7 = 0;
        bVar4 = false;
        do {
          uVar1 = concealed_packs[lVar7];
          bVar11 = (byte)uVar1;
          bVar3 = bVar4;
          if (((byte)(uVar1 >> 8) & 0xf) == 4) {
            bVar3 = true;
            if (bVar11 != win_tile) {
              bVar3 = bVar4;
            }
          }
          else if ((uVar1 >> 8 & 0xf) == 1) {
            if (bVar11 == win_tile) {
              bVar2 = true;
            }
            else {
              bVar5 = (bool)(bVar5 | (bVar11 - 1 == (uint)win_tile || bVar11 + 1 == (uint)win_tile))
              ;
            }
          }
          lVar7 = lVar7 + 1;
          bVar4 = bVar3;
        } while (pack_cnt != lVar7);
        lVar7 = 0x9a;
        if (((bVar5) || (lVar7 = 0x9c, bVar2)) || (lVar7 = 0x9e, bVar3)) {
          *(undefined2 *)((long)*fan_table + lVar7) = 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void adjust_by_waiting_form(const pack_t *concealed_packs, intptr_t pack_cnt, const tile_t *standing_tiles, intptr_t standing_cnt,
    tile_t win_tile, fan_table_t &fan_table) {
    // 全求人和四杠不计单钓将，也不可能有边张、嵌张
    if (fan_table[MELDED_HAND] || fan_table[FOUR_KONGS]) {
        return;
    }

    useful_table_t waiting_table;  // 听牌标记表
    if (!is_basic_form_wait(standing_tiles, standing_cnt, &waiting_table)) {
        return;
    }

    if (pack_cnt == 5) {  // 门清状态
        // 判断是否为七对听牌
        useful_table_t temp_table;
        if (is_seven_pairs_wait(standing_tiles, standing_cnt, &temp_table)) {
            // 合并听牌标记表
            std::transform(std::begin(temp_table), std::end(temp_table), std::begin(waiting_table),
                std::begin(waiting_table), [](bool w, bool t) { return w || t; });
        }
    }

    // 统计听牌张数，听牌数大于1张，不计边张、嵌张、单钓将
    if (1 != std::count(std::begin(waiting_table), std::end(waiting_table), true)) {
        return;
    }

    // 听1张的情况，看和牌张处于什么位置
    // 边张0x01 嵌张0x02 单钓将0x04
    uint8_t pos_flag = 0;

    for (intptr_t i = 0; i < pack_cnt; ++i) {
        switch (pack_get_type(concealed_packs[i])) {
        case PACK_TYPE_CHOW: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x02U;  // 嵌张
            }
            else if (mid_tile + 1 == win_tile || mid_tile - 1 == win_tile) {
                pos_flag |= 0x01U;  // 边张
            }
            break;
        }
        case PACK_TYPE_PAIR: {
            tile_t mid_tile = pack_get_tile(concealed_packs[i]);
            if (mid_tile == win_tile) {
                pos_flag |= 0x04U;  // 单钓将
            }
            break;
        }
        default:
            break;
        }
    }

    // 当多种可能存在时，只能计其中一种
    if (pos_flag & 0x01U) {
        fan_table[EDGE_WAIT] = 1;
    }
    else if (pos_flag & 0x02U) {
        fan_table[CLOSED_WAIT] = 1;
    }
    else if (pos_flag & 0x04U) {
        fan_table[SINGLE_WAIT] = 1;
    }
}